

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapDelay(Ivy_Man_t *pAig)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  int i;
  int iVar4;
  
  iVar4 = 0;
  for (i = 0; i < pAig->vPos->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vPos,i);
    piVar3 = (int *)(*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe);
    if ((0xfffffffd < (piVar3[2] & 0xfU) - 7) &&
       (iVar1 = (int)*(short *)(*(long *)((long)pAig->pData + 0x10) + 8 +
                               (long)*(int *)((long)pAig->pData + 8) * (long)*piVar3),
       iVar4 <= iVar1)) {
      iVar4 = iVar1;
    }
  }
  return iVar4;
}

Assistant:

int Ivy_FastMapDelay( Ivy_Man_t * pAig )
{
    Ivy_Supp_t * pSupp;
    Ivy_Obj_t * pObj;
    int i, DelayMax = 0;
    Ivy_ManForEachPo( pAig, pObj, i )
    {
        pObj = Ivy_ObjFanin0(pObj);
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pSupp = Ivy_ObjSupp( pAig, pObj );
        if ( DelayMax < pSupp->Delay )
            DelayMax = pSupp->Delay;
    }
    return DelayMax;
}